

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O0

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitExpr
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,CallExpression *expr)

{
  bool bVar1;
  uint uVar2;
  add_pointer_t<const_slang::ast::CallExpression::SystemCallInfo> ptVar3;
  reference ppEVar4;
  SystemSubroutine *pSVar5;
  Expression *in_RDI;
  Expression *arg;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  size_t argIndex;
  add_pointer_t<const_slang::ast::CallExpression::SystemCallInfo> sysCall;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
  *in_stack_00000060;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
  *in_stack_ffffffffffffffb0;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_40;
  undefined1 in_stack_ffffffffffffffc8 [16];
  long local_20;
  
  slang::ast::CallExpression::visitExprsNoArgs<slang::analysis::DataFlowAnalysis&>
            (in_stack_ffffffffffffffc8._8_8_,in_stack_ffffffffffffffc8._0_8_);
  ptVar3 = std::
           get_if<slang::ast::CallExpression::SystemCallInfo,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                     ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                       *)0x9e032f);
  local_20 = 0;
  slang::ast::CallExpression::arguments((CallExpression *)0x9e0347);
  local_40._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDI);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
            (in_stack_ffffffffffffffb8);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (ptVar3 != (add_pointer_t<const_slang::ast::CallExpression::SystemCallInfo>)0x0) {
        pSVar5 = not_null<const_slang::ast::SystemSubroutine_*>::operator->
                           ((not_null<const_slang::ast::SystemSubroutine_*> *)0x9e0400);
        if ((pSVar5->neverReturns & 1U) != 0) {
          setUnreachable(in_stack_00000060);
        }
      }
      return;
    }
    ppEVar4 = __gnu_cxx::
              __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
              ::operator*(&local_40);
    in_stack_ffffffffffffffb0 =
         (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState> *)
         *ppEVar4;
    if (ptVar3 == (add_pointer_t<const_slang::ast::CallExpression::SystemCallInfo>)0x0) {
LAB_009e03c6:
      visit<slang::ast::Expression>(in_stack_ffffffffffffffb0,in_RDI);
    }
    else {
      pSVar5 = not_null<const_slang::ast::SystemSubroutine_*>::operator->
                         ((not_null<const_slang::ast::SystemSubroutine_*> *)0x9e03b4);
      uVar2 = (*pSVar5->_vptr_SystemSubroutine[4])(pSVar5,local_20);
      if ((uVar2 & 1) == 0) goto LAB_009e03c6;
    }
    local_20 = local_20 + 1;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++(&local_40);
  } while( true );
}

Assistant:

void visitExpr(const CallExpression& expr) {
        expr.visitExprsNoArgs(DERIVED);

        auto sysCall = std::get_if<CallExpression::SystemCallInfo>(&expr.subroutine);
        size_t argIndex = 0;
        for (auto arg : expr.arguments()) {
            if (!sysCall || !sysCall->subroutine->isArgUnevaluated(argIndex))
                visit(*arg);
            argIndex++;
        }

        if (sysCall && sysCall->subroutine->neverReturns)
            setUnreachable();
    }